

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer pBVar7;
  pointer pbVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int __val;
  string binSavePath;
  json buffer;
  JsonDocument output;
  json buffers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string defaultBinFilename;
  string baseDir;
  string binUri;
  string defaultBinFileExt;
  string local_250;
  json images;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&output,(nullptr_t)0x0);
  GetBaseFilename(&defaultBinFilename,filename);
  std::__cxx11::string::string((string *)&defaultBinFileExt,".bin",(allocator *)&images);
  lVar5 = std::__cxx11::string::rfind((char)&defaultBinFilename,0x2e);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&images,(ulong)&defaultBinFilename);
    std::__cxx11::string::operator=((string *)&defaultBinFilename,(string *)&images);
    std::__cxx11::string::~string((string *)&images);
  }
  GetBaseDir(&baseDir,filename);
  if (baseDir._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&baseDir);
  }
  SerializeGltfModel(model,&output);
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedUris.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&buffers,(nullptr_t)0x0);
  uVar10 = 0;
  do {
    uVar11 = (ulong)uVar10;
    uVar6 = ((long)(model->buffers).
                   super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(model->buffers).
                  super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0xf0;
    if (uVar6 <= uVar11) {
      anon_unknown_57::JsonAddMember(&output,"buffers",&buffers);
      if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json(&images,(nullptr_t)0x0);
        for (uVar10 = 0; uVar9 = (ulong)uVar10,
            uVar9 < (ulong)(((long)(model->images).
                                   super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(model->images).
                                  super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x168);
            uVar10 = uVar10 + 1) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&binSavePath,(nullptr_t)0x0);
          UpdateImageObject((model->images).
                            super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar9,&baseDir,uVar10,
                            embedImages,&this->WriteImageData,this->write_image_user_data_);
          SerializeGltfImage((model->images).
                             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar9,(json *)&binSavePath);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::push_back(&images,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)&binSavePath);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)&binSavePath);
        }
        anon_unknown_57::JsonAddMember(&output,"images",&images);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&images);
      }
      if (writeBinary) {
        anon_unknown_57::JsonToString(&binSavePath,&output,-1);
        std::ofstream::ofstream(&images,(filename->_M_dataplus)._M_p,_S_bin);
        WriteBinaryGltfStream((ostream *)&images,&binSavePath);
      }
      else {
        anon_unknown_57::JsonToString(&binSavePath,&output,prettyPrint - 1 | 2);
        std::ofstream::ofstream(&images,(filename->_M_dataplus)._M_p,_S_out);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 != '\0') {
          WriteGltfStream((ostream *)&images,&binSavePath);
        }
      }
      std::ofstream::~ofstream(&images);
      std::__cxx11::string::~string((string *)&binSavePath);
LAB_00282e93:
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&buffers);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&usedUris);
      std::__cxx11::string::~string((string *)&baseDir);
      std::__cxx11::string::~string((string *)&defaultBinFileExt);
      std::__cxx11::string::~string((string *)&defaultBinFilename);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&output);
      return uVar6 <= uVar11;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&buffer,(nullptr_t)0x0);
    if (embedBuffers) {
      SerializeGltfBuffer((model->buffers).
                          super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar11,&buffer);
    }
    else {
      binSavePath._M_dataplus._M_p = (pointer)&binSavePath.field_2;
      binSavePath._M_string_length = 0;
      binSavePath.field_2._M_local_buf[0] = '\0';
      binUri._M_dataplus._M_p = (pointer)&binUri.field_2;
      binUri._M_string_length = 0;
      binUri.field_2._M_local_buf[0] = '\0';
      pBVar7 = (model->buffers).
               super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pBVar7[uVar11].uri._M_string_length == 0) ||
         (bVar2 = IsDataURI(&pBVar7[uVar11].uri), bVar2)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,
                       &defaultBinFilename,&defaultBinFileExt);
        std::__cxx11::string::operator=((string *)&binUri,(string *)&images);
        std::__cxx11::string::~string((string *)&images);
        __val = 0;
        bVar2 = true;
LAB_00282a21:
        pbVar1 = usedUris.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar8 = usedUris.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar2) {
          do {
            bVar2 = pbVar8 != pbVar1;
            if (pbVar8 == pbVar1) goto LAB_00282a21;
            iVar4 = std::__cxx11::string::compare((string *)&binUri);
            pbVar8 = pbVar8 + 1;
          } while (iVar4 != 0);
          std::__cxx11::to_string(&local_250,__val);
          std::operator+(&local_2f0,&defaultBinFilename,&local_250);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &images,&local_2f0,&defaultBinFileExt);
          __val = __val + 1;
          std::__cxx11::string::operator=((string *)&binUri,(string *)&images);
          std::__cxx11::string::~string((string *)&images);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_250);
          goto LAB_00282a21;
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&binUri);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&usedUris,&binUri);
      JoinPath((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,&baseDir
               ,&binUri);
      std::__cxx11::string::operator=((string *)&binSavePath,(string *)&images);
      std::__cxx11::string::~string((string *)&images);
      pBVar7 = (model->buffers).
               super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11;
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,
                 binSavePath._M_dataplus._M_p,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::ofstream::~ofstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images);
      }
      else {
        std::ostream::write((char *)&images,
                            (long)(pBVar7->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        std::ofstream::close();
        std::ofstream::~ofstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images);
        std::__cxx11::string::string((string *)&images,"byteLength",(allocator *)&local_2f0);
        SerializeNumberProperty<unsigned_long>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,
                   (long)*(pointer *)
                          ((long)&(pBVar7->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl + 8) -
                   (long)(pBVar7->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&buffer);
        std::__cxx11::string::~string((string *)&images);
        std::__cxx11::string::string((string *)&images,"uri",(allocator *)&local_2f0);
        SerializeStringProperty
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,
                   &binUri,&buffer);
        std::__cxx11::string::~string((string *)&images);
        if ((pBVar7->name)._M_string_length != 0) {
          std::__cxx11::string::string((string *)&images,"name",(allocator *)&local_2f0);
          SerializeStringProperty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images,
                     &pBVar7->name,&buffer);
          std::__cxx11::string::~string((string *)&images);
        }
        if ((char)(pBVar7->extras).type_ != '\0') {
          std::__cxx11::string::string((string *)&images,"extras",(allocator *)&local_2f0);
          SerializeValue((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &images,&pBVar7->extras,&buffer);
          std::__cxx11::string::~string((string *)&images);
        }
      }
      std::__cxx11::string::~string((string *)&binUri);
      std::__cxx11::string::~string((string *)&binSavePath);
      if (cVar3 == '\0') {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&buffer);
        goto LAB_00282e93;
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back(&buffers,&buffer);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&buffer);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(Model *model, const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    if (embedBuffers) {
      SerializeGltfBuffer(model->buffers[i], buffer);
    } else {
      std::string binSavePath;
      std::string binUri;
      if (!model->buffers[i].uri.empty() && !IsDataURI(model->buffers[i].uri)) {
        binUri = model->buffers[i].uri;
      } else {
        binUri = defaultBinFilename + defaultBinFileExt;
        bool inUse = true;
        int numUsed = 0;
        while (inUse) {
          inUse = false;
          for (const std::string &usedName : usedUris) {
            if (binUri.compare(usedName) != 0) continue;
            inUse = true;
            binUri = defaultBinFilename + std::to_string(numUsed++) +
                     defaultBinFileExt;
            break;
          }
        }
      }
      usedUris.push_back(binUri);
      binSavePath = JoinPath(baseDir, binUri);
      if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                               binUri)) {
        return false;
      }
    }
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfFile(filename, JsonToString(output));
  } else {
    WriteGltfFile(filename, JsonToString(output, (prettyPrint ? 2 : -1)));
  }

  return true;
}